

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::SequenceNode::increment(SequenceNode *this)

{
  bool bVar1;
  Token *pTVar2;
  Node *pNVar3;
  Twine local_1b0;
  Twine local_198;
  Token local_180;
  undefined4 local_144;
  Token local_140;
  Token local_108;
  Twine local_d0;
  Token local_b8;
  Token local_80;
  undefined1 local_48 [8];
  Token T;
  SequenceNode *this_local;
  
  T.Value.field_2._8_8_ = this;
  bVar1 = Node::failed(&this->super_Node);
  if (bVar1) {
    this->IsAtEnd = true;
    this->CurrentEntry = (Node *)0x0;
    return;
  }
  if (this->CurrentEntry != (Node *)0x0) {
    (*this->CurrentEntry->_vptr_Node[1])();
  }
  pTVar2 = Node::peekNext(&this->super_Node);
  Token::Token((Token *)local_48,pTVar2);
  if (this->SeqType == ST_Block) {
    if (local_48._0_4_ == TK_Error) {
LAB_00296802:
      this->IsAtEnd = true;
      this->CurrentEntry = (Node *)0x0;
    }
    else if (local_48._0_4_ == TK_BlockEntry) {
      Node::getNext(&local_80,&this->super_Node);
      Token::~Token(&local_80);
      pNVar3 = Node::parseBlockNode(&this->super_Node);
      this->CurrentEntry = pNVar3;
      if (this->CurrentEntry == (Node *)0x0) {
        this->IsAtEnd = true;
        this->CurrentEntry = (Node *)0x0;
      }
    }
    else {
      if (local_48._0_4_ != TK_BlockEnd) {
        Twine::Twine(&local_d0,"Unexpected token. Expected Block Entry or Block End.");
        Node::setError(&this->super_Node,&local_d0,(Token *)local_48);
        goto LAB_00296802;
      }
      Node::getNext(&local_b8,&this->super_Node);
      Token::~Token(&local_b8);
      this->IsAtEnd = true;
      this->CurrentEntry = (Node *)0x0;
    }
  }
  else if (this->SeqType == ST_Indentless) {
    if ((local_48._0_4_ == TK_Error) || (local_48._0_4_ != TK_BlockEntry)) {
      this->IsAtEnd = true;
      this->CurrentEntry = (Node *)0x0;
    }
    else {
      Node::getNext(&local_108,&this->super_Node);
      Token::~Token(&local_108);
      pNVar3 = Node::parseBlockNode(&this->super_Node);
      this->CurrentEntry = pNVar3;
      if (this->CurrentEntry == (Node *)0x0) {
        this->IsAtEnd = true;
        this->CurrentEntry = (Node *)0x0;
      }
    }
  }
  else if (this->SeqType == ST_Flow) {
    switch(local_48._0_4_) {
    default:
      if ((this->WasPreviousTokenFlowEntry & 1U) == 0) {
        Twine::Twine(&local_1b0,"Expected , between entries!");
        Node::setError(&this->super_Node,&local_1b0,(Token *)local_48);
        this->IsAtEnd = true;
        this->CurrentEntry = (Node *)0x0;
      }
      else {
        pNVar3 = Node::parseBlockNode(&this->super_Node);
        this->CurrentEntry = pNVar3;
        if (this->CurrentEntry == (Node *)0x0) {
          this->IsAtEnd = true;
        }
        this->WasPreviousTokenFlowEntry = false;
      }
      break;
    case 2:
    case 5:
    case 6:
      Twine::Twine(&local_198,"Could not find closing ]!");
      Node::setError(&this->super_Node,&local_198,(Token *)local_48);
      this->IsAtEnd = true;
      this->CurrentEntry = (Node *)0x0;
      break;
    case 0xb:
      Node::getNext(&local_140,&this->super_Node);
      Token::~Token(&local_140);
      this->WasPreviousTokenFlowEntry = true;
      increment(this);
      local_144 = 1;
      goto LAB_00296a3c;
    case 0xd:
      Node::getNext(&local_180,&this->super_Node);
      Token::~Token(&local_180);
    case 0:
      this->IsAtEnd = true;
      this->CurrentEntry = (Node *)0x0;
    }
  }
  local_144 = 0;
LAB_00296a3c:
  Token::~Token((Token *)local_48);
  return;
}

Assistant:

void SequenceNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry)
    CurrentEntry->skip();
  Token T = peekNext();
  if (SeqType == ST_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Block Entry or Block End."
              , T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Indentless) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    default:
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Flow) {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      WasPreviousTokenFlowEntry = true;
      return increment();
    case Token::TK_FlowSequenceEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    case Token::TK_StreamEnd:
    case Token::TK_DocumentEnd:
    case Token::TK_DocumentStart:
      setError("Could not find closing ]!", T);
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      if (!WasPreviousTokenFlowEntry) {
        setError("Expected , between entries!", T);
        IsAtEnd = true;
        CurrentEntry = nullptr;
        break;
      }
      // Otherwise it must be a flow entry.
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) {
        IsAtEnd = true;
      }
      WasPreviousTokenFlowEntry = false;
      break;
    }
  }
}